

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetValidate(XL *out,char *val_path)

{
  HyperParam *pHVar1;
  runtime_error *this;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  allocator local_51;
  string local_50 [48];
  XLearn *local_20;
  char *local_18;
  
  local_20 = (XLearn *)*in_RDI;
  local_18 = in_RSI;
  pHVar1 = XLearn::GetHyperParam(local_20);
  if ((pHVar1->from_file & 1U) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Input for validation type Must equal to train\'s!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_18,&local_51);
  pHVar1 = XLearn::GetHyperParam(local_20);
  std::__cxx11::string::operator=((string *)&pHVar1->validate_set_file,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

XL_DLL int XLearnSetValidate(XL *out, const char *val_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (!xl->GetHyperParam().from_file){
    throw std::runtime_error("Input for validation type Must equal to train's!");
  }
  xl->GetHyperParam().validate_set_file = std::string(val_path);
  API_END();
}